

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileListOperation<duckdb::string_t,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>
               (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state,
               list_entry_t *target,AggregateFinalizeData *finalize_data)

{
  unsigned_long uVar1;
  bool bVar2;
  QuantileValue *q_00;
  size_type sVar3;
  reference puVar4;
  undefined8 *in_RDX;
  long *in_RSI;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *in_RDI;
  Interpolator<true> interp;
  value_type *quantile;
  unsigned_long *q;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_true> *__range3;
  idx_t lower;
  list_entry_t *entry;
  string_t *v_t;
  string_t *rdata;
  idx_t ridx;
  Vector *result;
  QuantileBindData *bind_data;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  reference in_stack_ffffffffffffff30;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *in_stack_ffffffffffffff40;
  Interpolator<true> *this;
  string_t *in_stack_ffffffffffffff48;
  Interpolator<true> *this_00;
  anon_union_16_2_67f50693_for_value local_b0;
  char *pcStack_a8;
  undefined8 local_98;
  AggregateFinalizeData *in_stack_ffffffffffffff70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  vector<unsigned_long,_true> *local_58;
  undefined8 local_50;
  long *local_48;
  string_t *local_40;
  string_t *local_38;
  QuantileValue *local_30;
  undefined8 local_28;
  QuantileBindData *local_20;
  undefined8 *local_18;
  long *local_10;
  vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar2 = std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::empty
                    (in_stack_ffffffffffffff40);
  if (bVar2) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffff70);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff30);
    local_20 = FunctionData::Cast<duckdb::QuantileBindData>
                         ((FunctionData *)in_stack_ffffffffffffff30);
    local_28 = duckdb::ListVector::GetEntry((Vector *)*local_18);
    q_00 = (QuantileValue *)duckdb::ListVector::GetListSize((Vector *)*local_18);
    this = (Interpolator<true> *)*local_18;
    local_30 = q_00;
    sVar3 = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                      (&(local_20->quantiles).
                        super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>)
    ;
    duckdb::ListVector::Reserve((Vector *)this,(ulong)(&q_00->val + sVar3));
    local_38 = FlatVector::GetData<duckdb::string_t>((Vector *)0xa65ea2);
    local_40 = std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::data
                         ((vector<duckdb::string_t,_std::allocator<duckdb::string_t>_> *)0xa65eb7);
    local_48 = local_10;
    *local_10 = (long)local_30;
    local_50 = 0;
    local_58 = &local_20->order;
    local_60._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff30,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_60);
      in_stack_ffffffffffffff30 =
           vector<duckdb::QuantileValue,_true>::operator[]
                     ((vector<duckdb::QuantileValue,_true> *)in_stack_ffffffffffffff30,
                      CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>::size(local_8);
      Interpolator<true>::Interpolator
                (this,q_00,(idx_t)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
      local_b0.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           Interpolator<true>::
           Operation<duckdb::string_t,duckdb::string_t,duckdb::QuantileDirect<duckdb::string_t>>
                     (this_00,in_stack_ffffffffffffff48,(Vector *)this,
                      (QuantileDirect<duckdb::string_t> *)q_00);
      uVar1 = *puVar4;
      *(Interpolator<true> **)&local_38[(long)(&local_30->val + uVar1)].value = this_00;
      local_38[(long)(&local_30->val + uVar1)].value.pointer.ptr = pcStack_a8;
      local_50 = local_98;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_60);
    }
    sVar3 = std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::size
                      (&(local_20->quantiles).
                        super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>)
    ;
    local_48[1] = sVar3;
    duckdb::ListVector::SetListSize((Vector *)*local_18,*local_48 + local_48[1]);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}